

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O2

REF_STATUS ref_math_normalize(REF_DBL *normal)

{
  undefined1 auVar1 [16];
  REF_STATUS RVar2;
  undefined8 in_R9;
  double dVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  double dVar7;
  double dVar8;
  
  auVar5 = *(undefined1 (*) [16])normal;
  dVar4 = auVar5._0_8_;
  dVar6 = auVar5._8_8_;
  dVar3 = normal[2];
  dVar7 = SQRT(dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6);
  dVar8 = dVar7 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  if (dVar4 <= -dVar4) {
    dVar4 = -dVar4;
  }
  RVar2 = 4;
  if (dVar4 < dVar8) {
    if (dVar6 <= -dVar6) {
      dVar6 = -dVar6;
    }
    if (dVar6 < dVar8) {
      dVar6 = dVar3;
      if (dVar3 <= -dVar3) {
        dVar6 = -dVar3;
      }
      if (dVar6 < dVar8) {
        dVar3 = dVar3 / dVar7;
        auVar1._8_8_ = dVar7;
        auVar1._0_8_ = dVar7;
        auVar5 = divpd(auVar5,auVar1);
        *(undefined1 (*) [16])normal = auVar5;
        normal[2] = dVar3;
        dVar3 = dVar3 * dVar3 + auVar5._0_8_ * auVar5._0_8_ + auVar5._8_8_ * auVar5._8_8_ + -1.0;
        if (dVar3 <= -dVar3) {
          dVar3 = -dVar3;
        }
        RVar2 = 0;
        if (1e-13 <= dVar3) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",
                 0x29,"ref_math_normalize","vector length not unity",in_R9,0);
          RVar2 = 1;
        }
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_math_normalize(REF_DBL *normal) {
  REF_DBL length;

  length = sqrt(ref_math_dot(normal, normal));

  if (!ref_math_divisible(normal[0], length) ||
      !ref_math_divisible(normal[1], length) ||
      !ref_math_divisible(normal[2], length))
    return REF_DIV_ZERO;

  normal[0] /= length;
  normal[1] /= length;
  normal[2] /= length;

  length = ref_math_dot(normal, normal);
  RAS((ABS(length - 1.0) < 1.0e-13), "vector length not unity");

  return REF_SUCCESS;
}